

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O2

UBool __thiscall icu_63::MessagePattern::isChoice(MessagePattern *this,int32_t index)

{
  char16_t cVar1;
  UnicodeString *this_00;
  
  this_00 = &this->msg;
  cVar1 = UnicodeString::doCharAt(this_00,index);
  if (((((cVar1 & 0xffdfU) == 0x43) &&
       (cVar1 = UnicodeString::doCharAt(this_00,index + 1), (cVar1 & 0xffdfU) == 0x48)) &&
      (cVar1 = UnicodeString::doCharAt(this_00,index + 2), (cVar1 & 0xffdfU) == 0x4f)) &&
     ((cVar1 = UnicodeString::doCharAt(this_00,index + 3), (cVar1 & 0xffdfU) == 0x49 &&
      (cVar1 = UnicodeString::doCharAt(this_00,index + 4), (cVar1 & 0xffdfU) == 0x43)))) {
    cVar1 = UnicodeString::doCharAt(this_00,index + 5);
    return (cVar1 & 0xffdfU) == 0x45;
  }
  return '\0';
}

Assistant:

UBool
MessagePattern::isChoice(int32_t index) {
    UChar c;
    return
        ((c=msg.charAt(index++))==u_c || c==u_C) &&
        ((c=msg.charAt(index++))==u_h || c==u_H) &&
        ((c=msg.charAt(index++))==u_o || c==u_O) &&
        ((c=msg.charAt(index++))==u_i || c==u_I) &&
        ((c=msg.charAt(index++))==u_c || c==u_C) &&
        ((c=msg.charAt(index))==u_e || c==u_E);
}